

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O2

set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
* __thiscall
CsSignal::SlotBase::internal_senderList
          (set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
           *__return_storage_ptr__,SlotBase *this)

{
  _Rb_tree_header *p_Var1;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *prVar2;
  read_handle receiverListHandle;
  SignalBase *local_40;
  read_handle local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38.m_ptr = &(this->m_possibleSenders).m_obj;
  local_38.m_accessed = false;
  prVar2 = libguarded::
           rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
           ::read_handle::operator*(&local_38);
  while (prVar2 = (rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
                   *)(prVar2->m_head)._M_b._M_p,
        prVar2 != (rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
                   *)0x0) {
    local_40 = (SignalBase *)(prVar2->m_write_mutex).super___mutex_base._M_mutex.__align;
    std::
    _Rb_tree<CsSignal::SignalBase*,CsSignal::SignalBase*,std::_Identity<CsSignal::SignalBase*>,std::less<CsSignal::SignalBase*>,std::allocator<CsSignal::SignalBase*>>
    ::_M_insert_unique<CsSignal::SignalBase*>
              ((_Rb_tree<CsSignal::SignalBase*,CsSignal::SignalBase*,std::_Identity<CsSignal::SignalBase*>,std::less<CsSignal::SignalBase*>,std::allocator<CsSignal::SignalBase*>>
                *)__return_storage_ptr__,&local_40);
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
  ::read_handle::~read_handle(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::set<CsSignal::SignalBase *> CsSignal::SlotBase::internal_senderList() const
{
   std::set<SignalBase *> retval;

   auto receiverListHandle = m_possibleSenders.lock_read();

   for (auto &sender : *receiverListHandle) {
      retval.insert(const_cast<SignalBase *>(sender));
   }

   return retval;
}